

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O0

void legacy::checkSecondarySlicingCrit
               (set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>
                *criteria_nodes,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *secondaryControlCriteria,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *secondaryDataCriteria,LLVMNode *nd)

{
  bool bVar1;
  set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *in_RCX;
  pair<std::_Rb_tree_const_iterator<dg::LLVMNode_*>,_bool> pVar2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000020;
  undefined1 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffd9;
  
  bVar1 = isCallTo(nd,in_stack_00000020);
  if (bVar1) {
    pVar2 = std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::
            insert(in_RCX,(value_type *)
                          CONCAT71(in_stack_ffffffffffffffd9,in_stack_ffffffffffffffd8));
    in_stack_ffffffffffffffd8 = pVar2.second;
  }
  bVar1 = isCallTo(nd,in_stack_00000020);
  if (bVar1) {
    std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::insert
              (in_RCX,(value_type *)CONCAT71(in_stack_ffffffffffffffd9,in_stack_ffffffffffffffd8));
  }
  return;
}

Assistant:

static inline void
checkSecondarySlicingCrit(std::set<LLVMNode *> &criteria_nodes,
                          const std::set<std::string> &secondaryControlCriteria,
                          const std::set<std::string> &secondaryDataCriteria,
                          LLVMNode *nd) {
    if (isCallTo(nd, secondaryControlCriteria))
        criteria_nodes.insert(nd);
    if (isCallTo(nd, secondaryDataCriteria)) {
        // XXX: Not fully supported, so add it...

        // static std::set<LLVMNode *> reported;
        // if (reported.insert(nd).second) {
        //     llvm::errs()
        //             << "WARNING: Found possible data secondary slicing
        //             criterion: "
        //             << *nd->getValue() << "\n";
        //     llvm::errs() << "This is not fully supported, so adding to be
        //     sound\n";
        // }
        criteria_nodes.insert(nd);
    }
}